

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3StrICmp(char *zLeft,char *zRight)

{
  byte *pbStack_28;
  int c;
  uchar *b;
  uchar *a;
  char *zRight_local;
  char *zLeft_local;
  
  pbStack_28 = (byte *)zRight;
  for (b = (uchar *)zLeft; ((uint)""[*b] - (uint)""[*pbStack_28] == 0 && (*b != '\0')); b = b + 1) {
    pbStack_28 = pbStack_28 + 1;
  }
  return (uint)""[*b] - (uint)""[*pbStack_28];
}

Assistant:

SQLITE_PRIVATE int sqlite3StrICmp(const char *zLeft, const char *zRight){
  unsigned char *a, *b;
  int c;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  for(;;){
    c = (int)UpperToLower[*a] - (int)UpperToLower[*b];
    if( c || *a==0 ) break;
    a++;
    b++;
  }
  return c;
}